

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

ptrdiff_t mp_check_extl(char *cur,char *end)

{
  byte bVar1;
  ulong uVar2;
  
  if (end <= cur) {
    __assert_fail("cur < end",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                  0x846,"ptrdiff_t mp_check_extl(const char *, const char *)");
  }
  bVar1 = *cur;
  if (mp_type_hint[bVar1] == MP_EXT) {
    if ((bVar1 & 0xf0) == 0xd0) {
      uVar2 = 1;
    }
    else {
      if (2 < (byte)(bVar1 + 0x39)) {
        __assert_fail("c >= 0xc7 && c <= 0xc9",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                      ,0x84d,"ptrdiff_t mp_check_extl(const char *, const char *)");
      }
      uVar2 = (ulong)((1 << (bVar1 + 0x39 & 0x1f)) + 1);
    }
    return (ptrdiff_t)(cur + (uVar2 - (long)end) + 1);
  }
  __assert_fail("mp_typeof(*cur) == MP_EXT",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                0x847,"ptrdiff_t mp_check_extl(const char *, const char *)");
}

Assistant:

MP_IMPL ptrdiff_t
mp_check_extl(const char *cur, const char *end)
{
	assert(cur < end);
	assert(mp_typeof(*cur) == MP_EXT);
	uint8_t c = mp_load_u8(&cur);
	if ((c & 0xf0) == 0xd0) {
		return 1 - (end - cur);
	}

	assert(c >= 0xc7 && c <= 0xc9);
	return (1 << (c - 0xc7)) + 1 - (end - cur); /* 0xc7 -> 2, 0xc8 -> 3, 0xc9 ->5 */
}